

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileline.c
# Opt level: O2

int tcmalloc_backtrace_syminfo
              (backtrace_state *state,uintptr_t pc,backtrace_syminfo_callback callback,
              backtrace_error_callback error_callback,void *data)

{
  int iVar1;
  int iVar2;
  
  iVar1 = fileline_initialize(state,error_callback,data);
  iVar2 = 0;
  if ((iVar1 != 0) && (state->fileline_initialization_failed == 0)) {
    (*state->syminfo_fn)(state,pc,callback,error_callback,data);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
backtrace_syminfo (struct backtrace_state *state, uintptr_t pc,
		   backtrace_syminfo_callback callback,
		   backtrace_error_callback error_callback, void *data)
{
  if (!fileline_initialize (state, error_callback, data))
    return 0;

  if (state->fileline_initialization_failed)
    return 0;

  state->syminfo_fn (state, pc, callback, error_callback, data);
  return 1;
}